

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketContext.h
# Opt level: O1

tuple<unsigned_char_*,_unsigned_long> __thiscall
SL::WS_LITE::WebSocketContext::Inflate(WebSocketContext *this,uchar *data,size_t data_len)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  int iVar4;
  void *pvVar5;
  undefined4 in_ECX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  _Head_base<0UL,_unsigned_char_*,_false> _Var6;
  uchar *extraout_RDX_02;
  size_t sVar7;
  tuple<unsigned_char_*,_unsigned_long> tVar8;
  ostringstream buffersl134nonesd;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  *(size_t *)(data + 0x18) = data_len;
  *(undefined4 *)(data + 0x20) = in_ECX;
  while( true ) {
    *(undefined8 *)(data + 0x30) = *(undefined8 *)(data + 0x10);
    data[0x38] = '\0';
    data[0x39] = '\0';
    data[0x3a] = '\x10';
    data[0x3b] = '\0';
    iVar4 = inflate(data + 0x18,4);
    if (*(int *)(data + 0x20) == 0) break;
    uVar1 = *(uint *)(data + 0x38);
    sVar7 = *(long *)(data + 8) + (0x100000 - (ulong)uVar1);
    *(size_t *)(data + 8) = sVar7;
    pvVar5 = realloc(*(void **)data,sVar7);
    *(void **)data = pvVar5;
    if (pvVar5 == (void *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"INFLATE MEMORY ALLOCATION ERROR!!! Tried to realloc ",0x34);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      Log(ERROR_log_level,
          "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketContext.h"
          ,0x3e,"Inflate",(ostringstream *)local_1a8);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      this->InflateBuffer = (uchar *)0x0;
      this->InflateBufferSize = 0;
      _Var6._M_head_impl = extraout_RDX;
      goto LAB_0012b02d;
    }
    memcpy((void *)(sVar7 + (long)pvVar5),*(void **)(data + 0x10),0x100000 - (ulong)uVar1);
    if ((iVar4 != -5) || (*(ulong *)(data + 0x138) < *(ulong *)(data + 8))) break;
  }
  inflateReset(data + 0x18);
  _Var6._M_head_impl = extraout_RDX_00;
  if (((iVar4 == 0) || (iVar4 == -5)) &&
     (uVar2 = *(ulong *)(data + 8), uVar2 <= *(ulong *)(data + 0x138))) {
    if (uVar2 == 0) {
      sVar3 = *(size_t *)(data + 0x10);
      _Var6._M_head_impl = (uchar *)(0x100000 - (ulong)*(uint *)(data + 0x38));
      this->InflateBuffer = _Var6._M_head_impl;
      this->InflateBufferSize = sVar3;
      goto LAB_0012b02d;
    }
    uVar1 = *(uint *)(data + 0x38);
    sVar7 = uVar2 + (0x100000 - (ulong)uVar1);
    *(size_t *)(data + 8) = sVar7;
    pvVar5 = realloc(*(void **)data,sVar7);
    *(void **)data = pvVar5;
    if (pvVar5 != (void *)0x0) {
      memcpy((void *)(sVar7 + (long)pvVar5),*(void **)(data + 0x10),0x100000 - (ulong)uVar1);
      this->InflateBuffer = *(uchar **)(data + 8);
      this->InflateBufferSize = (size_t)pvVar5;
      _Var6._M_head_impl = extraout_RDX_01;
      goto LAB_0012b02d;
    }
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"INFLATE MEMORY ALLOCATION ERROR!!! Tried to realloc ",0x34);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    Log(ERROR_log_level,
        "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketContext.h"
        ,0x4f,"Inflate",(ostringstream *)local_1a8);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    _Var6._M_head_impl = extraout_RDX_02;
  }
  this->InflateBuffer = (uchar *)0x0;
  this->InflateBufferSize = 0;
LAB_0012b02d:
  tVar8.super__Tuple_impl<0UL,_unsigned_char_*,_unsigned_long>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = _Var6._M_head_impl;
  tVar8.super__Tuple_impl<0UL,_unsigned_char_*,_unsigned_long>.super__Tuple_impl<1UL,_unsigned_long>
  .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
       (_Head_base<1UL,_unsigned_long,_false>)(_Head_base<1UL,_unsigned_long,_false>)this;
  return (tuple<unsigned_char_*,_unsigned_long>)
         tVar8.super__Tuple_impl<0UL,_unsigned_char_*,_unsigned_long>;
}

Assistant:

auto Inflate(unsigned char *data, size_t data_len)
        {
            InflationStream.next_in = (Bytef *)data;
            InflationStream.avail_in = data_len;

            int err;
            do {
                InflationStream.next_out = (Bytef *)TempInflateBuffer.get();
                InflationStream.avail_out = LARGE_BUFFER_SIZE;
                err = ::inflate(&InflationStream, Z_FINISH);
                if (!InflationStream.avail_in) {
                    break;
                }
                auto growsize = LARGE_BUFFER_SIZE - InflationStream.avail_out;
                InflateBufferSize += growsize;
                auto beforesize = InflateBufferSize;
                InflateBuffer = static_cast<unsigned char *>(realloc(InflateBuffer, InflateBufferSize));
                if (!InflateBuffer) {
                    SL_WS_LITE_LOG(Logging_Levels::ERROR_log_level, "INFLATE MEMORY ALLOCATION ERROR!!! Tried to realloc " << InflateBufferSize);
                    return returnemptyinflate();
                }
                memcpy(InflateBuffer + beforesize, TempInflateBuffer.get(), growsize);
            } while (err == Z_BUF_ERROR && InflateBufferSize <= MaxPayload);

            inflateReset(&InflationStream);

            if ((err != Z_BUF_ERROR && err != Z_OK) || InflateBufferSize > MaxPayload) {
                return returnemptyinflate();
            }
            if (InflateBufferSize > 0) {
                auto growsize = LARGE_BUFFER_SIZE - InflationStream.avail_out;
                InflateBufferSize += growsize;
                auto beforesize = InflateBufferSize;
                InflateBuffer = static_cast<unsigned char *>(realloc(InflateBuffer, InflateBufferSize));
                if (!InflateBuffer) {
                    SL_WS_LITE_LOG(Logging_Levels::ERROR_log_level, "INFLATE MEMORY ALLOCATION ERROR!!! Tried to realloc " << InflateBufferSize);
                    return returnemptyinflate();
                }
                memcpy(InflateBuffer + beforesize, TempInflateBuffer.get(), growsize);
                return std::make_tuple(InflateBuffer, InflateBufferSize);
            }
            return std::make_tuple(TempInflateBuffer.get(), LARGE_BUFFER_SIZE - (size_t)InflationStream.avail_out);
        }